

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

void Abc_NtkFxInsert(Abc_Ntk_t *pNtk,Vec_Wec_t *vCubes)

{
  Vec_Int_t *pVVar1;
  Abc_Obj_t *pFanin;
  int *piVar2;
  void **ppvVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  Abc_Obj_t *pAVar7;
  void *__s;
  char *pSop;
  uint uVar8;
  int **ppiVar9;
  char *pcVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  Vec_Ptr_t *pVVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  void *local_70;
  void *local_60;
  
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                  ,0xbd,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
  }
  iVar12 = vCubes->nSize;
  if (0 < (long)iVar12) {
    lVar6 = (long)iVar12 << 4;
    lVar16 = 0;
    iVar14 = -1;
    do {
      if (*(int *)((long)&vCubes->pArray->nSize + lVar16) < 1) {
        __assert_fail("Vec_IntSize(vCube) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                      ,0xc2,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
      }
      iVar18 = **(int **)((long)&vCubes->pArray->pArray + lVar16);
      if (iVar18 < iVar14) {
        __assert_fail("Lit <= Vec_IntEntry(vCube, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                      ,0xc3,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
      }
      lVar16 = lVar16 + 0x10;
      iVar14 = iVar18;
    } while (lVar6 != lVar16);
    if (0 < iVar12) {
      lVar16 = 0;
      iVar12 = 0;
      do {
        if (*(int *)((long)&vCubes->pArray->nSize + lVar16) < 1) goto LAB_002cad52;
        iVar14 = **(int **)((long)&vCubes->pArray->pArray + lVar16);
        if (iVar12 <= iVar14) {
          iVar12 = iVar14;
        }
        lVar16 = lVar16 + 0x10;
      } while (lVar6 != lVar16);
      goto LAB_002ca840;
    }
  }
  iVar12 = 0;
LAB_002ca840:
  iVar14 = pNtk->vObjs->nSize;
  if (iVar12 < iVar14) {
    puts("The network is unchanged by fast extract.");
    return;
  }
  do {
    pAVar7 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
    if (iVar14 != pAVar7->Id) {
      __assert_fail("i == (int)Abc_ObjId(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                    ,0xd3,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
    }
    iVar14 = iVar14 + 1;
  } while (iVar12 + 1 != iVar14);
  pVVar15 = pNtk->vObjs;
  iVar12 = pVVar15->nSize;
  uVar17 = iVar12 - 1;
  iVar14 = iVar12;
  if (uVar17 < 0xf) {
    iVar14 = 0x10;
  }
  if ((iVar14 == 0) || (local_60 = malloc((long)iVar14 << 2), local_60 == (void *)0x0)) {
    local_60 = (void *)0x0;
    iVar14 = iVar12;
  }
  else {
    memset(local_60,0,(long)iVar12 * 4);
    uVar17 = pVVar15->nSize - 1;
    iVar14 = pVVar15->nSize;
  }
  iVar18 = 0x10;
  if (0xe < uVar17) {
    iVar18 = iVar14;
  }
  if ((iVar18 == 0) || (local_70 = malloc((long)iVar18 << 2), local_70 == (void *)0x0)) {
    local_70 = (void *)0x0;
  }
  else {
    memset(local_70,0,(long)iVar14 * 4);
  }
  iVar18 = vCubes->nSize;
  if (0 < (long)iVar18) {
    ppiVar9 = &vCubes->pArray->pArray;
    uVar11 = 0;
    do {
      if (*(int *)((long)ppiVar9 + -4) < 1) goto LAB_002cad52;
      iVar5 = **ppiVar9;
      lVar6 = (long)iVar5;
      if ((lVar6 < 0) || (iVar14 <= iVar5)) goto LAB_002cad52;
      iVar13 = *(int *)((long)local_70 + lVar6 * 4);
      if (iVar13 == 0) {
        if (iVar12 <= iVar5) {
LAB_002cae0c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(int *)((long)local_60 + lVar6 * 4) = (int)uVar11;
      }
      *(int *)((long)local_70 + lVar6 * 4) = iVar13 + 1;
      uVar11 = uVar11 + 1;
      ppiVar9 = ppiVar9 + 2;
    } while (uVar11 < (ulong)(long)iVar18);
  }
  iVar18 = pVVar15->nSize;
  iVar5 = 0x10;
  if (0xe < iVar18 - 1U) {
    iVar5 = iVar18;
  }
  iVar13 = iVar18;
  if (iVar5 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar5 << 2);
    if (__s == (void *)0x0) {
      __s = (void *)0x0;
    }
    else {
      memset(__s,0xff,(long)iVar18 << 2);
      iVar13 = pVVar15->nSize;
    }
  }
  if (0 < iVar13) {
    uVar11 = 0;
    do {
      pAVar7 = (Abc_Obj_t *)pVVar15->pArray[uVar11];
      if ((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 7)) {
        Abc_ObjRemoveFanins(pAVar7);
        if ((long)iVar14 <= (long)uVar11) {
LAB_002cad52:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = *(int *)((long)local_70 + uVar11 * 4);
        if (iVar5 < 1) {
          __assert_fail("Vec_IntEntry(vCount, i) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                        ,0xe6,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
        }
        if ((long)iVar12 <= (long)uVar11) goto LAB_002cad52;
        iVar13 = 0;
        do {
          uVar17 = *(int *)((long)local_60 + uVar11 * 4) + iVar13;
          if (((int)uVar17 < 0) || (vCubes->nSize <= (int)uVar17)) goto LAB_002cadce;
          pVVar1 = vCubes->pArray;
          iVar4 = pVVar1[uVar17].nSize;
          if (iVar4 < 1) goto LAB_002cad52;
          if (uVar11 != (uint)*pVVar1[uVar17].pArray) {
            __assert_fail("Vec_IntEntry( vCube, 0 ) == i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                          ,0xea,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
          }
          if (iVar4 != 1) {
            lVar6 = 1;
            do {
              if (pVVar1[uVar17].pArray[lVar6] < 0) goto LAB_002cad71;
              uVar8 = (uint)pVVar1[uVar17].pArray[lVar6] >> 1;
              if (pNtk->vObjs->nSize <= (int)uVar8) goto LAB_002cad90;
              pFanin = (Abc_Obj_t *)pNtk->vObjs->pArray[uVar8];
              iVar5 = pFanin->Id;
              lVar16 = (long)iVar5;
              if ((lVar16 < 0) || (iVar18 <= iVar5)) goto LAB_002cad52;
              if (*(int *)((long)__s + lVar16 * 4) < 0) {
                *(int *)((long)__s + lVar16 * 4) = (pAVar7->vFanins).nSize;
                Abc_ObjAddFanin(pAVar7,pFanin);
                iVar4 = pVVar1[uVar17].nSize;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < iVar4);
            iVar5 = *(int *)((long)local_70 + uVar11 * 4);
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < iVar5);
        pSop = Abc_SopStart((Mem_Flex_t *)pNtk->pManFunc,iVar5,(pAVar7->vFanins).nSize);
        iVar5 = *(int *)((long)local_70 + uVar11 * 4);
        if (0 < iVar5) {
          iVar13 = 0;
          pcVar10 = pSop;
          do {
            uVar17 = *(int *)((long)local_60 + uVar11 * 4) + iVar13;
            if (((int)uVar17 < 0) || (vCubes->nSize <= (int)uVar17)) {
LAB_002cadce:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                            ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            pVVar1 = vCubes->pArray;
            if (pVVar1[uVar17].nSize < 1) goto LAB_002cad52;
            if (uVar11 != (uint)*pVVar1[uVar17].pArray) {
              __assert_fail("Vec_IntEntry( vCube, 0 ) == i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                            ,0xf9,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
            }
            if (pVVar1[uVar17].nSize != 1) {
              lVar6 = 1;
              do {
                uVar8 = pVVar1[uVar17].pArray[lVar6];
                if ((int)uVar8 < 0) {
LAB_002cad71:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                if (pNtk->vObjs->nSize <= (int)(uVar8 >> 1)) {
LAB_002cad90:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                iVar5 = *(int *)((long)pNtk->vObjs->pArray[uVar8 >> 1] + 0x10);
                if (((long)iVar5 < 0) || (iVar18 <= iVar5)) goto LAB_002cad52;
                iVar5 = *(int *)((long)__s + (long)iVar5 * 4);
                if (((long)iVar5 < 0) || ((pAVar7->vFanins).nSize <= iVar5)) {
                  __assert_fail("iFanin >= 0 && iFanin < Abc_ObjFaninNum(pNode)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                                ,0xfe,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
                }
                pcVar10[iVar5] = (byte)uVar8 & 1 ^ 0x31;
                lVar6 = lVar6 + 1;
              } while (lVar6 < pVVar1[uVar17].nSize);
              iVar5 = *(int *)((long)local_70 + uVar11 * 4);
            }
            pcVar10 = pcVar10 + (long)(pAVar7->vFanins).nSize + 3;
            iVar13 = iVar13 + 1;
          } while (iVar13 < iVar5);
        }
        if (((char *)(pAVar7->field_5).pData != (char *)0x0) &&
           (iVar5 = Abc_SopIsComplement((char *)(pAVar7->field_5).pData), iVar5 != 0)) {
          Abc_SopComplement(pSop);
        }
        (pAVar7->field_5).pData = pSop;
        if (0 < (pAVar7->vFanins).nSize) {
          piVar2 = (pAVar7->vFanins).pArray;
          ppvVar3 = pAVar7->pNtk->vObjs->pArray;
          lVar6 = 0;
          do {
            iVar5 = *(int *)((long)ppvVar3[piVar2[lVar6]] + 0x10);
            if (((long)iVar5 < 0) || (iVar18 <= iVar5)) goto LAB_002cae0c;
            *(undefined4 *)((long)__s + (long)iVar5 * 4) = 0xffffffff;
            lVar6 = lVar6 + 1;
          } while (lVar6 < (pAVar7->vFanins).nSize);
        }
      }
      uVar11 = uVar11 + 1;
      pVVar15 = pNtk->vObjs;
    } while ((long)uVar11 < (long)pVVar15->nSize);
  }
  if (local_60 != (void *)0x0) {
    free(local_60);
  }
  if (local_70 != (void *)0x0) {
    free(local_70);
  }
  if (__s == (void *)0x0) {
    return;
  }
  free(__s);
  return;
}

Assistant:

void Abc_NtkFxInsert( Abc_Ntk_t * pNtk, Vec_Wec_t * vCubes )
{
    Vec_Int_t * vCube, * vPres, * vFirst, * vCount;
    Abc_Obj_t * pNode, * pFanin;
    char * pCube, * pSop;
    int i, k, v, Lit, iFanin, iNodeMax = 0;
    assert( Abc_NtkIsSopLogic(pNtk) );
    // check that cubes have no gaps and are ordered by first node
    Lit = -1;
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        assert( Vec_IntSize(vCube) > 0 );
        assert( Lit <= Vec_IntEntry(vCube, 0) );
        Lit = Vec_IntEntry(vCube, 0);
    }
    // find the largest index
    Vec_WecForEachLevel( vCubes, vCube, i )
        iNodeMax = Abc_MaxInt( iNodeMax, Vec_IntEntry(vCube, 0) );
    // quit if nothing changes
    if ( iNodeMax < Abc_NtkObjNumMax(pNtk) )
    {
        printf( "The network is unchanged by fast extract.\n" );
        return;
    }
    // create new nodes
    for ( i = Abc_NtkObjNumMax(pNtk); i <= iNodeMax; i++ )
    {
        pNode = Abc_NtkCreateNode( pNtk );
        assert( i == (int)Abc_ObjId(pNode) );
    }
    // create node fanins
    vFirst = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    vCount = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        iFanin = Vec_IntEntry( vCube, 0 );
        if ( Vec_IntEntry(vCount, iFanin) == 0 )
            Vec_IntWriteEntry( vFirst, iFanin, i );
        Vec_IntAddToEntry( vCount, iFanin, 1 );
    }
    // create node SOPs
    vPres = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
//        if ( Vec_IntEntry(vCount, i) == 0 ) continue;
        Abc_ObjRemoveFanins( pNode );
        // create fanins
        assert( Vec_IntEntry(vCount, i) > 0 );
        for ( k = 0; k < Vec_IntEntry(vCount, i); k++ )
        {
            vCube = Vec_WecEntry( vCubes, Vec_IntEntry(vFirst, i) + k );
            assert( Vec_IntEntry( vCube, 0 ) == i );
            Vec_IntForEachEntryStart( vCube, Lit, v, 1 )
            {
                pFanin = Abc_NtkObj(pNtk, Abc_Lit2Var(Lit));
                if ( Vec_IntEntry(vPres, Abc_ObjId(pFanin)) >= 0 )
                    continue;
                Vec_IntWriteEntry(vPres, Abc_ObjId(pFanin), Abc_ObjFaninNum(pNode));
                Abc_ObjAddFanin( pNode, pFanin );
            }
        }
        // create SOP
        pSop = pCube = Abc_SopStart( (Mem_Flex_t *)pNtk->pManFunc, Vec_IntEntry(vCount, i), Abc_ObjFaninNum(pNode) );
        for ( k = 0; k < Vec_IntEntry(vCount, i); k++ )
        {
            vCube = Vec_WecEntry( vCubes, Vec_IntEntry(vFirst, i) + k );
            assert( Vec_IntEntry( vCube, 0 ) == i );
            Vec_IntForEachEntryStart( vCube, Lit, v, 1 )
            {
                pFanin = Abc_NtkObj(pNtk, Abc_Lit2Var(Lit));
                iFanin = Vec_IntEntry(vPres, Abc_ObjId(pFanin));
                assert( iFanin >= 0 && iFanin < Abc_ObjFaninNum(pNode) );
                pCube[iFanin] = Abc_LitIsCompl(Lit) ? '0' : '1';
            }
            pCube += Abc_ObjFaninNum(pNode) + 3;
        }
        // complement SOP if the original one was complemented
        if ( pNode->pData && Abc_SopIsComplement((char *)pNode->pData) )
            Abc_SopComplement( pSop );
        pNode->pData = pSop;
        // clean fanins
        Abc_ObjForEachFanin( pNode, pFanin, v )
            Vec_IntWriteEntry( vPres, Abc_ObjId(pFanin), -1 );
    }
    Vec_IntFree( vFirst );
    Vec_IntFree( vCount );
    Vec_IntFree( vPres );
}